

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O1

void Allocations::forgetArea(int64_t fileID,int64_t position,int64_t space)

{
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>,_std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
  pVar1;
  Key key;
  key_type local_18;
  
  local_18.fileID = fileID;
  local_18.position = position;
  __position = std::
               _Rb_tree<Allocations::Key,_std::pair<const_Allocations::Key,_Allocations::Usage>,_std::_Select1st<std::pair<const_Allocations::Key,_Allocations::Usage>_>,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
               ::find(&allocations._M_t,&local_18);
  if (((_Rb_tree_header *)__position._M_node != &allocations._M_t._M_impl.super__Rb_tree_header) &&
     (__position._M_node[1]._M_left == (_Base_ptr)space)) {
    std::
    _Rb_tree<Allocations::Key,std::pair<Allocations::Key_const,Allocations::Usage>,std::_Select1st<std::pair<Allocations::Key_const,Allocations::Usage>>,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::Usage>>>
    ::erase_abi_cxx11_((_Rb_tree<Allocations::Key,std::pair<Allocations::Key_const,Allocations::Usage>,std::_Select1st<std::pair<Allocations::Key_const,Allocations::Usage>>,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::Usage>>>
                        *)&allocations,__position);
  }
  pVar1 = std::
          _Rb_tree<Allocations::Key,_std::pair<const_Allocations::Key,_Allocations::SubArea>,_std::_Select1st<std::pair<const_Allocations::Key,_Allocations::SubArea>_>,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
          ::equal_range(&subAreas._M_t,&local_18);
  std::
  _Rb_tree<Allocations::Key,_std::pair<const_Allocations::Key,_Allocations::SubArea>,_std::_Select1st<std::pair<const_Allocations::Key,_Allocations::SubArea>_>,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
  ::_M_erase_aux(&subAreas._M_t,(_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
  return;
}

Assistant:

void Allocations::forgetArea(int64_t fileID, int64_t position, int64_t space)
{
	Key key{ fileID, position };
	auto it = allocations.find(key);
	if (it != allocations.end() && it->second.space == space)
		allocations.erase(it);

	subAreas.erase(key);
}